

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> * __thiscall
AlignmentRecord::coveredPositions(AlignmentRecord *this)

{
  size_type sVar1;
  const_reference pvVar2;
  ShortDnaSequence *this_00;
  long in_RSI;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *in_RDI;
  char qual_1;
  char c_1;
  uint i_1;
  char qual;
  char c;
  uint i;
  int q;
  int r;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_positions;
  undefined6 in_stack_ffffffffffffff48;
  char in_stack_ffffffffffffff4e;
  char in_stack_ffffffffffffff4f;
  ShortDnaSequence *in_stack_ffffffffffffff50;
  uint local_54;
  uint local_20;
  
  std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::vector
            ((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
             0x280afe);
  for (local_20 = 0;
      sVar1 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)(in_RSI + 0x48)), local_20 < sVar1;
      local_20 = local_20 + 1) {
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RSI + 0x48),(ulong)local_20);
    switch(*pvVar2) {
    case 'D':
      break;
    case 'H':
      break;
    case 'I':
    case 'S':
      break;
    case 'M':
      ShortDnaSequence::operator[]
                (in_stack_ffffffffffffff50,
                 CONCAT17(in_stack_ffffffffffffff4f,
                          CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
      ShortDnaSequence::qualityChar
                (in_stack_ffffffffffffff50,
                 CONCAT17(in_stack_ffffffffffffff4f,
                          CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
      std::array<float,_127UL>::operator[]
                ((array<float,_127UL> *)in_stack_ffffffffffffff50,
                 CONCAT17(in_stack_ffffffffffffff4f,
                          CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
      std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::push_back
                ((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
                 in_stack_ffffffffffffff50,
                 (value_type *)
                 CONCAT17(in_stack_ffffffffffffff4f,
                          CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
    }
  }
  if ((*(byte *)(in_RSI + 0x184) & 1) == 0) {
    for (local_54 = 0;
        sVar1 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)(in_RSI + 0xf8)), local_54 < sVar1
        ; local_54 = local_54 + 1) {
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RSI + 0xf8),(ulong)local_54);
      this_00 = (ShortDnaSequence *)(ulong)((int)*pvVar2 - 0x44);
      switch(this_00) {
      case (ShortDnaSequence *)0x0:
        break;
      case (ShortDnaSequence *)0x4:
        break;
      case (ShortDnaSequence *)0x5:
      case (ShortDnaSequence *)0xf:
        break;
      case (ShortDnaSequence *)0x9:
        in_stack_ffffffffffffff4f =
             ShortDnaSequence::operator[]
                       (this_00,CONCAT17(in_stack_ffffffffffffff4f,
                                         CONCAT16(in_stack_ffffffffffffff4e,
                                                  in_stack_ffffffffffffff48)));
        in_stack_ffffffffffffff4e =
             ShortDnaSequence::qualityChar
                       (this_00,CONCAT17(in_stack_ffffffffffffff4f,
                                         CONCAT16(in_stack_ffffffffffffff4e,
                                                  in_stack_ffffffffffffff48)));
        std::array<float,_127UL>::operator[]
                  ((array<float,_127UL> *)this_00,
                   CONCAT17(in_stack_ffffffffffffff4f,
                            CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
        std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
        push_back((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
                  this_00,(value_type *)
                          CONCAT17(in_stack_ffffffffffffff4f,
                                   CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<AlignmentRecord::mapValue> AlignmentRecord::coveredPositions() const{
    std::vector<AlignmentRecord::mapValue> cov_positions;
    //position in ref
    int r = this->start1;
    //position in querybases / quality string of read
    int q = 0;
    for (unsigned int i = 0; i< this->cigar1_unrolled.size(); ++i){
        char c = this->cigar1_unrolled[i];
        switch(c){
            case 'M': {
                c = this->sequence1[q];
                char qual = this->sequence1.qualityChar(q);
                cov_positions.push_back({r,c,qual,error_probs[qual],q,0});
                //char d = this->sequence1[q];
                ++q;
                ++r;
                break;
            }
            case 'D': {
                ++r;
                break;
            }
            case 'S':
            case 'I': {
                ++q;
                break;
            }
            case 'H':
                break;
        }
    }
    //In case of a paired end read
    if (!this->single_end){
        assert(this->start1 <= this->start2);
            //position in ref
            r = this->start2;
            //position in query bases
            q = 0;
            //in case of overlapping paired end it is declared as a single end
            //if (r <= this->end1){
            //   this->single_end = true;
            //}
            for (unsigned int i = 0; i< this->cigar2_unrolled.size(); ++i){
                char c = this->cigar2_unrolled[i];
                switch(c){
                    case 'M': {
                        c = this->sequence2[q];
                        char qual = this->sequence2.qualityChar(q);
                        cov_positions.push_back({r,c,qual,error_probs[qual],q,1});
                        ++q;
                        ++r;
                        break;
                    }
                    case 'D': {
                        ++r;
                        break;
                    }
                    case 'S':
                    case 'I': {
                        ++q;
                        break;
                    }
                    case 'H':
                        break;
              }
           }
        }
    return cov_positions;
}